

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void free_cond(TCGContext_conflict2 *tcg_ctx,DisasCompare_conflict *c)

{
  DisasCompare_conflict *c_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  if ((c->g1 & 1U) == 0) {
    tcg_temp_free_i32(tcg_ctx,c->v1);
  }
  if ((c->g2 & 1U) == 0) {
    tcg_temp_free_i32(tcg_ctx,c->v2);
  }
  return;
}

Assistant:

static void free_cond(TCGContext *tcg_ctx, DisasCompare *c)
{
    if (!c->g1) {
        tcg_temp_free(tcg_ctx, c->v1);
    }
    if (!c->g2) {
        tcg_temp_free(tcg_ctx, c->v2);
    }
}